

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_red.c
# Opt level: O1

void ppRedBelt(word *a)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = a[3];
  uVar2 = 3;
  uVar3 = a[2];
  do {
    uVar4 = uVar1 << 7 ^ uVar1 * 4 ^ uVar1 * 2 ^ a[uVar2 - 2] ^ uVar1;
    a[uVar2 - 2] = uVar4;
    uVar1 = uVar1 >> 0x39 ^ uVar3 ^ uVar1 >> 0x3e ^ uVar1 >> 0x3f;
    a[uVar2 - 1] = uVar1;
    uVar2 = uVar2 - 1;
    uVar3 = uVar4;
  } while (1 < uVar2);
  return;
}

Assistant:

void ppRedBelt(word a[])
{
	const size_t mw = W_OF_B(128);
	size_t n = 2 * mw;
	ASSERT(wwIsValid(a, 2 * mw));
	ASSERT(mw * B_PER_W == 128);
	while (--n >= mw)
	{
		a[n - mw] ^= a[n] ^ a[n] << 1 ^ a[n] << 2 ^ a[n] << 7;
		a[n - mw + 1] ^= a[n] >> (B_PER_W - 1) ^
			a[n] >> (B_PER_W - 2) ^ a[n] >> (B_PER_W - 7);
	}
}